

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void under_ground(int mode)

{
  int mode_local;
  
  if ((u._1052_1_ & 1) == 0) {
    if ((mode == 1) || (under_ground::dela != '\0')) {
      cls();
      under_ground::dela = '\0';
    }
    else if (mode == 2) {
      under_ground::dela = '\x01';
    }
    else {
      newsym((int)u.ux,(int)u.uy);
    }
  }
  return;
}

Assistant:

void under_ground(int mode)
{
    static boolean dela;

    /* swallowing has a higher precedence than under ground */
    if (u.uswallow) return;

    /* full update */
    if (mode == 1 || dela) {
	cls();
	dela = FALSE;
    }
    /* delayed full update */
    else if (mode == 2) {
	dela = TRUE;
	return;
    }
    /* limited update */
    else
	newsym(u.ux,u.uy);
}